

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavUtility.cpp
# Opt level: O1

WavHeaderTypeGroup WavParserHelper::GetWavHeaderType(ifstream *in_File)

{
  WavHeaderTypeGroup WVar1;
  ulong uVar2;
  ulong uVar3;
  char ckID [4];
  short wavHeaderSubType;
  char ckID_2 [4];
  long wavHeaderType;
  int local_3a;
  undefined1 local_36 [2];
  int local_34;
  long local_30;
  
  if (((byte)in_File[*(long *)(*(long *)in_File + -0x18) + 0x20] & 5) != 0) {
    WVar1.MajorType = Invalid;
    WVar1.SubType = Normal;
    return WVar1;
  }
  uVar3 = 0;
  std::istream::seekg((long)in_File,0x10);
  std::istream::read((char *)in_File,(long)&local_30);
  std::istream::read((char *)in_File,(long)local_36);
  if (local_30 < 0x1c) {
    if (local_30 != 0x10) {
      uVar2 = 0;
      if (local_30 == 0x12) {
        std::istream::seekg((long)in_File,0x26);
        std::istream::read((char *)in_File,(long)&local_3a);
        uVar3 = 2;
        uVar2 = 0;
      }
      goto LAB_00109dbe;
    }
    std::istream::seekg((long)in_File,0x24);
    std::istream::read((char *)in_File,(long)&local_3a);
    if (local_3a == 0x61746164) {
      uVar3 = 1;
    }
    else {
      uVar3 = (ulong)(local_3a == 0x74786562) << 2;
    }
  }
  else {
    if (local_30 == 0x1c) {
      std::istream::seekg((long)in_File,_S_beg);
      uVar3 = 4;
      std::istream::read((char *)in_File,(long)&local_3a);
      uVar2 = 0x300000000;
      if (local_3a != 0x34364652) {
        uVar2 = 0;
      }
      goto LAB_00109dbe;
    }
    uVar2 = 0;
    if (local_30 != 0x28) goto LAB_00109dbe;
    std::istream::seekg((long)in_File,0x24);
    uVar3 = 4;
    std::istream::read((char *)in_File,(long)&local_3a);
    uVar2 = 0;
    if (local_3a == 0x61746164) goto LAB_00109dbe;
    if (local_3a != 0x74786562) {
      std::istream::seekg((long)in_File,0x3c);
      std::istream::read((char *)in_File,(long)&local_34);
      uVar3 = 3;
      uVar2 = (ulong)(local_34 != 0x74636166) << 0x21;
      goto LAB_00109dbe;
    }
  }
  uVar2 = 0;
LAB_00109dbe:
  return (WavHeaderTypeGroup)(uVar3 | uVar2);
}

Assistant:

WavHeaderTypeGroup WavParserHelper::GetWavHeaderType(std::ifstream &in_File)
{
	WavHeaderTypeGroup HeaderTypeGroup;

	if (in_File)
	{

		long wavHeaderType;
		in_File.seekg(16, std::ios_base::beg);
		in_File.read(reinterpret_cast<char *>(&wavHeaderType), sizeof(wavHeaderType));

		short wavHeaderSubType;
		in_File.read(reinterpret_cast<char *>(&wavHeaderSubType), sizeof(wavHeaderSubType));

		//Three Big Type : PCM / Non-PCM / Extensible
		if (wavHeaderType == 16)
		{
			in_File.seekg(36, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));

			//Standard PCM
			if (!std::strncmp(ckID, "data", 4))
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Standard;
			}
			//StandardBWF
			else if (!std::strncmp(ckID, "bext", 4))
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Bwf;

				HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
			}
			else
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Invalid;
			}
		}
		else if (wavHeaderType == 18)
		{
			HeaderTypeGroup.MajorType = WavHeaderType::NonPCM;

			in_File.seekg(38, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));
			if (!std::strncmp(ckID, "fact", 4))
				HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
		}
		else if (wavHeaderType == 28)
		{
			HeaderTypeGroup.MajorType = WavHeaderType::Bwf;

			in_File.seekg(0, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));

			if (!std::strncmp(ckID, "RF64", 4))
				HeaderTypeGroup.SubType = WavHeaderSubType::RF64;
			else
				HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
		}
		else if (wavHeaderType == 40)
		{
			in_File.seekg(36, std::ios_base::beg);
			char ckID[4];
			in_File.read(ckID, sizeof(ckID));
			if (!std::strncmp(ckID, "data", 4) || !std::strncmp(ckID, "bext", 4))
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Bwf;
			}
			else
			{
				HeaderTypeGroup.MajorType = WavHeaderType::Extensible;

				in_File.seekg(60, std::ios_base::beg);
				char ckID[4];
				in_File.read(ckID, sizeof(ckID));
				if (!std::strncmp(ckID, "fact", 4))
					HeaderTypeGroup.SubType = WavHeaderSubType::Normal;
				else
					HeaderTypeGroup.SubType = WavHeaderSubType::NoFact;
			}
		}
		else
		{
			HeaderTypeGroup.MajorType = WavHeaderType::Invalid;
		}

		if (wavHeaderSubType == 0xFFFE)
			HeaderTypeGroup.SubType = WavHeaderSubType::Extensible;
	}

	return HeaderTypeGroup;
}